

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O3

ecvt_result * mjs::anon_unknown_1::do_ecvt(ecvt_result *__return_storage_ptr__,double m,int k)

{
  char cVar1;
  ecvt_result *peVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char cVar6;
  char temp [32];
  char local_48 [40];
  
  if (k < 1) {
    __assert_fail("k >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,0x12,"ecvt_result mjs::(anonymous namespace)::do_ecvt(double, int)");
  }
  __return_storage_ptr__->k = k;
  snprintf(local_48,0x20,"%1.*e",(ulong)(k - 1U));
  __return_storage_ptr__->s[0] = local_48[0];
  if (k != 1) {
    if (local_48[1] != '.') {
      __assert_fail("temp[1] == \'.\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                    ,0x1b,"ecvt_result mjs::(anonymous namespace)::do_ecvt(double, int)");
    }
    memcpy(__return_storage_ptr__->s + 1,local_48 + 2,(ulong)(k - 1U));
  }
  peVar2 = (ecvt_result *)(ulong)(uint)k;
  if (peVar2->s[(long)(local_48 + ((ulong)(k != 1) - 8))] == 'e') {
    pcVar5 = peVar2->s + ((ulong)(k != 1) - 7);
    cVar1 = local_48[(long)pcVar5];
    if ((cVar1 == '+') || (cVar1 == '-')) {
      cVar6 = local_48[(long)(pcVar5 + 1)];
      if (cVar6 == '\0') {
        iVar3 = 0;
      }
      else {
        pcVar5 = local_48 + (long)(pcVar5 + 2);
        iVar3 = 0;
        do {
          iVar3 = (int)cVar6 + iVar3 * 10 + -0x30;
          cVar6 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while (cVar6 != '\0');
      }
      iVar4 = -iVar3;
      if (cVar1 != '-') {
        iVar4 = iVar3;
      }
      __return_storage_ptr__->n = iVar4 + 1;
      __return_storage_ptr__->s[(long)peVar2] = '\0';
      return peVar2;
    }
  }
  __assert_fail("exp[-1] == \'e\' && (exp[0] == \'+\' || exp[0] == \'-\')",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                ,0x1f,"ecvt_result mjs::(anonymous namespace)::do_ecvt(double, int)");
}

Assistant:

ecvt_result do_ecvt(double m, int k) {
    assert(k >= 1); // k is the number of decimal digits in the representation

    ecvt_result res;
    res.k = k;
#if 1
    char temp[32];
    snprintf(temp, sizeof(temp), "%1.*e", k-1, m);
    res.s[0] = temp[0];
    if (k > 1) {
        assert(temp[1] == '.');
        std::memcpy(&res.s[1], &temp[2], k-1);
    }
    const char* exp = &temp[k+(k>1)+1];
    assert(exp[-1] == 'e' && (exp[0] == '+' || exp[0] == '-'));
    res.n = 0;
    for (int i = 1; exp[i]; ++i) {
        res.n = res.n*10 + exp[i] - '0';
    }
    if (exp[0] == '-') {
        res.n = -res.n;
    }
    ++res.n; // Adjust for "1." format part
#else
    int sign;                   // sign is set if the value is negative (never true since to_string handles that)
#ifdef _MSC_VER
    char s[_CVTBUFSIZE + 1];    // s is the decimal representation of the number
    _ecvt_s(s, m, k, &res.n, &sign);
#else
    const char* s = ecvt(m, k, &res.n, &sign);
#endif
    assert(sign == 0);
    assert((int)std::strlen(s) == k);
    std::memcpy(res.s, s, k);
#endif
    res.s[k] = '\0';
    return res;
}